

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

void __thiscall
CVmObjVector::insert_elements_undo(CVmObjVector *this,vm_obj_id_t self,int ins_idx,int add_cnt)

{
  size_t idx;
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t idx_00;
  vm_val_t ele;
  vm_val_t local_40;
  
  uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  uVar2 = (ulong)uVar1;
  set_element_count_undo(this,self,(long)add_cnt + uVar2);
  if (ins_idx < (int)(uint)uVar1) {
    uVar3 = uVar2;
    while ((long)ins_idx < (long)uVar3) {
      idx = uVar3 - 1;
      get_element(this,idx,&local_40);
      idx_00 = uVar3 + (long)add_cnt + -1;
      uVar3 = idx;
      if ((long)idx_00 < (long)uVar2) {
        set_element_undo(this,self,idx_00,&local_40);
      }
      else {
        set_element(this,idx_00,&local_40);
      }
    }
  }
  return;
}

Assistant:

void CVmObjVector::insert_elements_undo(VMG_ vm_obj_id_t self,
                                        int ins_idx, int add_cnt)
{
    /* note the new and old sizes */
    int old_cnt = get_element_count();
    int new_cnt = old_cnt + add_cnt;

    /* create the new elements */
    set_element_count_undo(vmg_ self, new_cnt);

    /* 
     *   Move the existing elements to their new slots.  Start with the
     *   starting index, and move it to its new position, since the starting
     *   index is the first element that needs to be moved.  Note that we
     *   start at the top and work down, to avoid overwriting any overlapping
     *   part of the new position block and the old position block.
     *   
     *   If we're inserting after the last element, there's no moving that
     *   needs to be done.  
     */
    if (ins_idx < old_cnt)
    {
        for (int idx = old_cnt - 1 ; idx >= ins_idx ; --idx)
        {
            /* get the value at this slot */
            vm_val_t ele;
            get_element(idx, &ele);

            /* calculate the new slot */
            int new_idx = idx + add_cnt;

            /* 
             *   if the new index is within the old size range, keep undo for
             *   the change; otherwise, no undo is necessary, since when we
             *   undo we'll be completely dropping this new slot 
             */
            if (new_idx < old_cnt)
                set_element_undo(vmg_ self, new_idx, &ele);
            else
                set_element(new_idx, &ele);
        }
    }
}